

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * boolToStr_abi_cxx11_(string *__return_storage_ptr__,bool *x)

{
  char *__s;
  allocator<char> local_19;
  bool *local_18;
  bool *x_local;
  
  __s = "false";
  if ((*x & 1U) != 0) {
    __s = "true";
  }
  local_18 = x;
  x_local = (bool *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

string boolToStr(const bool& x) { return x ? "true" : "false"; }